

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  undefined4 uVar1;
  cmCustomCommandGenerator *commands_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TargetType targetType;
  char *pcVar5;
  string *psVar6;
  ulong uVar7;
  undefined4 extraout_var;
  long lVar8;
  const_reference pvVar9;
  pointer this_00;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string local_450 [32];
  string local_430 [8];
  string hack_cmd;
  size_type rcurly;
  size_type lcurly;
  string local_3e0;
  undefined1 local_3c0 [8];
  string shellCommand;
  string local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  string local_220;
  char *local_200;
  char *val;
  string launcher;
  undefined1 local_1b0 [7];
  bool has_slash;
  byte local_189;
  undefined1 local_188 [7];
  bool had_slash;
  string local_168;
  undefined1 local_148 [8];
  string suffix;
  undefined1 local_120 [7];
  bool useCall;
  string cmd;
  undefined1 local_f8 [4];
  uint c;
  string currentBinDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string workingDir;
  string dir;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *comment;
  string *psStack_30;
  bool echo_comment_local;
  string *relative_local;
  cmGeneratorTarget *target_local;
  cmCustomCommandGenerator *ccg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  comment._7_1_ = echo_comment;
  psStack_30 = relative;
  relative_local = (string *)target;
  target_local = (cmGeneratorTarget *)ccg;
  ccg_local = (cmCustomCommandGenerator *)commands;
  commands_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if (((echo_comment) &&
      (pcVar5 = cmCustomCommandGenerator::GetComment(ccg), commands_00 = ccg_local,
      local_40 = pcVar5, pcVar5 != (char *)0x0)) && (*pcVar5 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar5,&local_61);
    AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)commands_00,&local_60,EchoGenerate,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(workingDir.field_2._M_local_buf + 8),(string *)psVar6);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
            ((string *)&rulePlaceholderExpander,(cmCustomCommandGenerator *)target_local);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)(workingDir.field_2._M_local_buf + 8),(string *)&rulePlaceholderExpander);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)(workingDir.field_2._M_local_buf + 8));
  }
  iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])()
  ;
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )&commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (pointer)CONCAT44(extraout_var,iVar3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&currentBinDir.field_2 + 8));
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_f8,(string *)psVar6);
  for (cmd.field_2._12_4_ = 0; uVar1 = cmd.field_2._12_4_,
      uVar4 = cmCustomCommandGenerator::GetNumberOfCommands
                        ((cmCustomCommandGenerator *)target_local), (uint)uVar1 < uVar4;
      cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1) {
    cmCustomCommandGenerator::GetCommand_abi_cxx11_
              ((string *)local_120,(cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      suffix.field_2._M_local_buf[0xf] = '\0';
      bVar2 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar2) {
        std::__cxx11::string::string((string *)local_148);
        uVar7 = std::__cxx11::string::size();
        if (4 < uVar7) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_188,(ulong)local_120);
          cmsys::SystemTools::LowerCase(&local_168,(string *)local_188);
          std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)local_188);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_148,".bat");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_148,".cmd"), bVar2)) {
            suffix.field_2._M_local_buf[0xf] = '\x01';
          }
        }
        std::__cxx11::string::~string((string *)local_148);
      }
      cmsys::SystemTools::ReplaceString((string *)local_120,"/./","/");
      lVar8 = std::__cxx11::string::find((char)local_120,0x2f);
      local_189 = lVar8 != -1;
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_1b0,(cmLocalGenerator *)this,(string *)local_f8,
                   (string *)local_120);
        std::__cxx11::string::operator=((string *)local_120,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
      }
      lVar8 = std::__cxx11::string::find((char)local_120,0x2f);
      if (((local_189 & 1) != 0) && (lVar8 == -1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&launcher.field_2 + 8),"./",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120);
        std::__cxx11::string::operator=
                  ((string *)local_120,(string *)(launcher.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)&val);
      psVar6 = relative_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"RULE_LAUNCH_CUSTOM",
                 (allocator<char> *)((long)&vars.SwiftSources + 7));
      pcVar5 = cmLocalGenerator::GetRuleLauncher
                         ((cmLocalGenerator *)this,(cmGeneratorTarget *)psVar6,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)((long)&vars.SwiftSources + 7));
      local_200 = pcVar5;
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables
                  ((RuleVariables *)((long)&output.field_2 + 8));
        cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)relative_local);
        output.field_2._8_8_ = std::__cxx11::string::c_str();
        targetType = cmGeneratorTarget::GetType((cmGeneratorTarget *)relative_local);
        vars.CMTargetName = cmState::GetTargetTypeName(targetType);
        std::__cxx11::string::string((string *)&outputs);
        local_360 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)target_local);
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_360);
        if (!bVar2) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_360,0);
          std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar9);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) != 0) {
            psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               ((cmLocalGenerator *)this);
            cmLocalGenerator::MaybeConvertToRelativePath
                      (&local_380,(cmLocalGenerator *)this,psVar6,(string *)&outputs);
            std::__cxx11::string::operator=((string *)&outputs,(string *)&local_380);
            std::__cxx11::string::~string((string *)&local_380);
          }
          cmOutputConverter::ConvertToOutputFormat
                    ((string *)((long)&shellCommand.field_2 + 8),
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)&outputs,SHELL);
          std::__cxx11::string::operator=
                    ((string *)&outputs,(string *)(shellCommand.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(shellCommand.field_2._M_local_buf + 8));
        }
        vars.PreprocessedSource = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=((string *)&val,local_200);
        this_00 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&commands1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_00,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            super_cmOutputConverter,(string *)&val,
                   (RuleVariables *)((long)&output.field_2 + 8));
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&val," ");
        }
        std::__cxx11::string::~string((string *)&outputs);
      }
      MaybeConvertWatcomShellCommand((string *)local_3c0,this,(string *)local_120);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        cmOutputConverter::ConvertToOutputFormat
                  (&local_3e0,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_120,SHELL);
        std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcurly,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::__cxx11::string::operator=((string *)local_120,(string *)&lcurly);
      std::__cxx11::string::~string((string *)&lcurly);
      cmCustomCommandGenerator::AppendArguments
                ((cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_,(string *)local_120);
      if (content != (ostream *)0x0) {
        lVar8 = std::__cxx11::string::c_str();
        lVar10 = std::__cxx11::string::size();
        std::operator<<(content,(char *)(lVar8 + lVar10));
      }
      if (((((this->BorlandMakeCurlyHack & 1U) != 0) &&
           (uVar7 = std::__cxx11::string::find((char)local_120,0x7b), uVar7 != 0xffffffffffffffff))
          && (lVar8 = std::__cxx11::string::size(), uVar7 < lVar8 - 1U)) &&
         ((hack_cmd.field_2._8_8_ = std::__cxx11::string::find((char)local_120,0x7d),
          hack_cmd.field_2._8_8_ == 0xffffffffffffffff || (uVar7 < (ulong)hack_cmd.field_2._8_8_))))
      {
        std::__cxx11::string::substr((ulong)local_430,(ulong)local_120);
        std::__cxx11::string::operator+=(local_430,"{{}");
        std::__cxx11::string::substr((ulong)local_450,(ulong)local_120);
        std::__cxx11::string::operator+=(local_430,local_450);
        std::__cxx11::string::~string(local_450);
        std::__cxx11::string::operator=((string *)local_120,local_430);
        std::__cxx11::string::~string(local_430);
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        if ((suffix.field_2._M_local_buf[0xf] & 1U) == 0) {
          bVar2 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((bVar2) &&
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_120), *pcVar5 == '\"'))
          {
            std::operator+(&local_490,"echo >nul && ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
            std::__cxx11::string::operator=((string *)local_120,(string *)&local_490);
            std::__cxx11::string::~string((string *)&local_490);
          }
        }
        else {
          std::operator+(&local_470,"call ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_470);
          std::__cxx11::string::~string((string *)&local_470);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&currentBinDir.field_2 + 8),(value_type *)local_120);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)&val);
    }
    std::__cxx11::string::~string((string *)local_120);
  }
  CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&currentBinDir.field_2 + 8),
                  (string *)((long)&workingDir.field_2 + 8),psStack_30);
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ccg_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&currentBinDir.field_2 + 8));
  std::__cxx11::string::~string((string *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&currentBinDir.field_2 + 8));
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)&commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)(workingDir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      const char* val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (val && *val) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType = cmState::GetTargetTypeName(target->GetType());
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeConvertToRelativePath(
              this->GetCurrentBinaryDirectory(), output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            std::string hack_cmd = cmd.substr(0, lcurly);
            hack_cmd += "{{}";
            hack_cmd += cmd.substr(lcurly + 1);
            cmd = hack_cmd;
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = "call " + cmd;
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = "echo >nul && " + cmd;
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  cmAppend(commands, commands1);
}